

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

Array<asl::File> __thiscall asl::Directory::items(Directory *this,String *which,ItemType t)

{
  String *this_00;
  Endian *pEVar1;
  Array<asl::File> AVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DIR *__dirp;
  dirent *pdVar6;
  int in_ECX;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  undefined4 in_register_00000014;
  String *this_01;
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  String name;
  FileInfo info;
  String dir;
  File local_120;
  String local_d8;
  stat data;
  
  this_01 = (String *)CONCAT44(in_register_00000014,t);
  this_00 = which + 1;
  Array<asl::File>::clear((Array<asl::File> *)this_00);
  bVar3 = String::operator!=(which,"");
  if (which->_size == 0) {
    paVar7 = &which->field_2;
  }
  else {
    paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(which->field_2)._str;
  }
  __name = (anon_union_16_2_78e7fdac_for_String_2 *)0x141d9a;
  if (bVar3) {
    __name = paVar7;
  }
  __dirp = opendir(__name->_space);
  if (__dirp == (DIR *)0x0) {
    AVar2._a = *(File **)this_00;
    *(File **)&this->_path = AVar2._a;
    LOCK();
    pEVar1 = &AVar2._a[-1]._endian;
    *pEVar1 = *pEVar1 + ENDIAN_LITTLE;
    UNLOCK();
  }
  else {
    bVar3 = String::endsWith(which,'/');
    if (bVar3) {
      String::String(&dir,which);
    }
    else {
      String::operator+(&dir,which,'/');
    }
    name.field_2._space[0] = '\0';
    name._size = 0;
    name._len = 0;
    bVar3 = String::contains(this_01,'*');
    if (bVar3) {
      bVar3 = String::operator!=(this_01,"*");
    }
    else {
      bVar3 = false;
    }
LAB_00137878:
    pdVar6 = readdir(__dirp);
    if (pdVar6 != (dirent *)0x0) {
      if (bVar3 != false) goto code_r0x00137895;
      goto LAB_00137946;
    }
    closedir(__dirp);
    AVar2._a = *(File **)this_00;
    *(File **)&this->_path = AVar2._a;
    LOCK();
    pEVar1 = &AVar2._a[-1]._endian;
    *pEVar1 = *pEVar1 + ENDIAN_LITTLE;
    UNLOCK();
    String::~String(&name);
    String::~String(&dir);
  }
  return (Array<asl::File>)(File *)this;
code_r0x00137895:
  String::String(&local_d8,pdVar6->d_name);
  iVar5 = String::indexOf(this_01,'*',0);
  if (iVar5 == -1) {
    bVar4 = String::operator==(&local_d8,this_01);
  }
  else {
    String::substring((String *)&local_120,this_01,0,iVar5);
    bVar4 = String::startsWith(&local_d8,(String *)&local_120);
    if (bVar4) {
      String::substring((String *)&info,this_01,iVar5 + 1);
      bVar4 = String::endsWith(&local_d8,(String *)&info);
      String::~String((String *)&info);
    }
    else {
      bVar4 = false;
    }
    String::~String((String *)&local_120);
  }
  String::~String(&local_d8);
  if (bVar4 != false) {
LAB_00137946:
    if ((pdVar6->d_name[0] != '.') ||
       ((pdVar6->d_name[1] != '\0' && ((pdVar6->d_name[1] != '.' || (pdVar6->d_name[2] != '\0'))))))
    {
      String::operator=(&name,&dir);
      String::operator+=(&name,pdVar6->d_name);
      paVar7 = &name.field_2;
      if (name._size != 0) {
        paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(name.field_2._1_7_,name.field_2._space[0]);
      }
      iVar5 = stat(paVar7->_space,(stat *)&data);
      if (iVar5 == 0) {
        if (in_ECX == 0) {
          if ((data.st_mode & 0xf000) == 0x4000) goto LAB_00137878;
        }
        else if ((in_ECX == 1) && ((data.st_mode & 0xf000) != 0x4000)) goto LAB_00137878;
        info.lastModified._t = (double)data.st_mtim.tv_sec;
        info.creationDate._t = (double)data.st_ctim.tv_sec;
        info.size = data.st_size;
        info.flags = data.st_mode;
        File::File(&local_120,&name,&info);
        Array<asl::File>::operator<<((Array<asl::File> *)this_00,&local_120);
        File::~File(&local_120);
      }
    }
  }
  goto LAB_00137878;
}

Assistant:

Array<File> Directory::items(const String& which, Directory::ItemType t)
{
	_files.clear();
	DIR* d = opendir(_path != ""? *_path : "/");
	if(!d)
		return _files;
	String dir = _path.endsWith('/')? _path : (_path+'/');
	String name;
	bool wildcard = which.contains('*') && which != "*";
	
	while(dirent* entry=readdir(d))
	{
		struct stat data;
		if(wildcard && !match(entry->d_name, which))
			continue;
		if(!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, ".."))
			continue;
		name = dir;
		name += (const char*)entry->d_name;
		if(!stat(name, &data)) {
			if( (t==DIRE && !S_ISDIR(data.st_mode)) ||
				(t==FILE && S_ISDIR(data.st_mode)) )
				continue;
			_files << File(name, infoFor(data));
		}
	}
	closedir(d);
	return _files;
}